

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-common.hpp
# Opt level: O3

void __thiscall
baryonyx::itm::default_cost_type<double>::default_cost_type
          (default_cost_type<double> *this,objective_function *obj_,int n)

{
  pointer poVar1;
  double *pdVar2;
  double *__s;
  pointer poVar3;
  long lVar4;
  ulong __n;
  
  this->obj = obj_;
  __n = 0xffffffffffffffff;
  if (-1 < n) {
    __n = (ulong)(uint)n << 3;
  }
  __s = (double *)operator_new__(__n);
  memset(__s,0,__n);
  (this->linear_elements)._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
  super__Head_base<0UL,_double_*,_false>._M_head_impl = __s;
  poVar3 = (obj_->elements).
           super__Vector_base<baryonyx::objective_function_element,_std::allocator<baryonyx::objective_function_element>_>
           ._M_impl.super__Vector_impl_data._M_start;
  poVar1 = (obj_->elements).
           super__Vector_base<baryonyx::objective_function_element,_std::allocator<baryonyx::objective_function_element>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  while( true ) {
    if (poVar3 == poVar1) {
      return;
    }
    lVar4 = (long)poVar3->variable_index;
    if ((lVar4 < 0) || (n <= poVar3->variable_index)) break;
    pdVar2 = &poVar3->factor;
    poVar3 = poVar3 + 1;
    __s[lVar4] = *pdVar2 + __s[lVar4];
  }
  itm::default_cost_type();
}

Assistant:

default_cost_type(const objective_function& obj_, int n)
      : obj(obj_)
      , linear_elements(std::make_unique<Float[]>(n))
    {
        for (const auto& elem : obj.elements) {
            bx_ensures(0 <= elem.variable_index && elem.variable_index < n);

            linear_elements[elem.variable_index] +=
              static_cast<Float>(elem.factor);
        }
    }